

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

void usage(char *argv0,char mode,int expected)

{
  long lVar1;
  
  if (expected != 0) {
    fprintf(_stderr,"Error: incorrect number of args for mode -%c: %d args required\n",
            (ulong)(uint)(int)mode,expected);
  }
  for (lVar1 = 0; lVar1 != 0x2c; lVar1 = lVar1 + 4) {
    fprintf(_stderr,(char *)((long)&usage_info_rel + (long)*(int *)((long)&usage_info_rel + lVar1)),
            argv0);
  }
  exit(1);
}

Assistant:

static NORETURN void usage(char *argv0, char mode, int expected)
{
	int i;
	if (expected)
	    fprintf(stderr, "Error: incorrect number of args for mode -%c: %d args required\n", mode, expected);
	
	for (i = 0; i < sizeof(usage_info)/sizeof(usage_info[0]); i++)
	    fprintf(stderr, usage_info[i], argv0);
	
	exit(1);
}